

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestTheAbilityOfTheCollectionToGrowItsCapacity_Test::
~ExtendedDataDictionaryTest_TestTheAbilityOfTheCollectionToGrowItsCapacity_Test
          (ExtendedDataDictionaryTest_TestTheAbilityOfTheCollectionToGrowItsCapacity_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtendedDataDictionaryTest, TestTheAbilityOfTheCollectionToGrowItsCapacity)
{
    ExtendableDataDictionary data_dictionary = ExtendableDataDictionary();
    ASSERT_EQ(0, data_dictionary.size());
    ASSERT_EQ(0, data_dictionary.NextFreeFid());
    for (int i = 0; i < 1000; i++)
    {
        FieldDef field_def(i, FieldTypeEnum::STRING,
                         "Bidder" + std::to_string(i),
                         FieldEncodingEnum::FIXED1, 1);
        data_dictionary.AddFieldDef(field_def);
        ASSERT_EQ(i + 1, data_dictionary.size());
        ASSERT_EQ(i + 1, data_dictionary.NextFreeFid());
    }
}